

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O3

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::EmitBufferManager(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
                    *this,ArenaAllocator *allocator,
                   CodePageAllocators<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                   *codePageAllocators,ScriptContext *scriptContext,ThreadContextInfo *threadContext
                   ,LPCWSTR name,HANDLE processHandle)

{
  this->allocations = (TEmitBufferAllocation *)0x0;
  this->allocator = allocator;
  this->scriptContext = scriptContext;
  this->threadContext = threadContext;
  Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
  Heap(&this->allocationHeap,allocator,codePageAllocators,processHandle);
  (this->criticalSection).super_CCLock.mutexPtr[0] = '\0';
  (this->criticalSection).super_CCLock.mutexPtr[1] = '\0';
  (this->criticalSection).super_CCLock.mutexPtr[2] = '\0';
  (this->criticalSection).super_CCLock.mutexPtr[3] = '\0';
  (this->criticalSection).super_CCLock.mutexPtr[4] = '\0';
  (this->criticalSection).super_CCLock.mutexPtr[5] = '\0';
  (this->criticalSection).super_CCLock.mutexPtr[6] = '\0';
  (this->criticalSection).super_CCLock.mutexPtr[7] = '\0';
  CCLock::Reset(&(this->criticalSection).super_CCLock,true);
  this->processHandle = processHandle;
  this->totalBytesCode = 0;
  this->totalBytesLoopBody = 0;
  this->totalBytesAlignment = 0;
  this->totalBytesCommitted = 0;
  this->totalBytesReserved = 0;
  this->name = name;
  return;
}

Assistant:

EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::EmitBufferManager(ArenaAllocator * allocator, CustomHeap::CodePageAllocators<TAlloc, TPreReservedAlloc> * codePageAllocators,
    Js::ScriptContext * scriptContext, ThreadContextInfo * threadContext, LPCWSTR name, HANDLE processHandle) :
    allocationHeap(allocator, codePageAllocators, processHandle),
    allocator(allocator),
    allocations(nullptr),
    scriptContext(scriptContext),
    threadContext(threadContext),
    processHandle(processHandle)
{
#if DBG_DUMP
    this->totalBytesCode = 0;
    this->totalBytesLoopBody = 0;
    this->totalBytesAlignment = 0;
    this->totalBytesCommitted = 0;
    this->totalBytesReserved = 0;
    this->name = name;
#endif
}